

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateSingleBuiltInAtDefinition
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst)

{
  bool bVar1;
  BuiltIn label_00;
  spv_const_context psVar2;
  BuiltIn label;
  Instruction *inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  label_00 = Decoration::builtin(decoration);
  if (label_00 == BuiltInWorkgroupSize) {
    this_local._4_4_ = ValidateWorkgroupSizeAtDefinition(this,decoration,inst);
  }
  else {
    psVar2 = ValidationState_t::context(this->_);
    bVar1 = spvIsVulkanEnv(psVar2->target_env);
    if (bVar1) {
      this_local._4_4_ = ValidateSingleBuiltInAtDefinitionVulkan(this,decoration,inst,label_00);
    }
    else {
      this_local._4_4_ = SPV_SUCCESS;
    }
  }
  return this_local._4_4_;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateSingleBuiltInAtDefinition(
    const Decoration& decoration, const Instruction& inst) {
  const spv::BuiltIn label = decoration.builtin();
  // Universial checks
  if (label == spv::BuiltIn::WorkgroupSize) {
    return ValidateWorkgroupSizeAtDefinition(decoration, inst);
  }

  if (spvIsVulkanEnv(_.context()->target_env)) {
    return ValidateSingleBuiltInAtDefinitionVulkan(decoration, inst, label);
  }
  return SPV_SUCCESS;
}